

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Add<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *prototype)

{
  int iVar1;
  Type *result;
  Type *prototype_local;
  RepeatedPtrFieldBase *this_local;
  
  if ((this->rep_ == (Rep *)0x0) || (this->rep_->allocated_size <= this->current_size_)) {
    if ((this->rep_ == (Rep *)0x0) || (this->rep_->allocated_size == this->total_size_)) {
      Reserve(this,this->total_size_ + 1);
    }
    this->rep_->allocated_size = this->rep_->allocated_size + 1;
    this_local = (RepeatedPtrFieldBase *)
                 GenericTypeHandler<caffe::NetStateRule>::NewFromPrototype(prototype,this->arena_);
    iVar1 = this->current_size_;
    this->current_size_ = iVar1 + 1;
    this->rep_->elements[iVar1] = this_local;
  }
  else {
    iVar1 = this->current_size_;
    this->current_size_ = iVar1 + 1;
    this_local = (RepeatedPtrFieldBase *)
                 cast<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
                           (this->rep_->elements[iVar1]);
  }
  return (Type *)this_local;
}

Assistant:

inline typename TypeHandler::Type* RepeatedPtrFieldBase::Add(
    typename TypeHandler::Type* prototype) {
  if (rep_ != NULL && current_size_ < rep_->allocated_size) {
    return cast<TypeHandler>(rep_->elements[current_size_++]);
  }
  if (!rep_ || rep_->allocated_size == total_size_) {
    Reserve(total_size_ + 1);
  }
  ++rep_->allocated_size;
  typename TypeHandler::Type* result =
      TypeHandler::NewFromPrototype(prototype, arena_);
  rep_->elements[current_size_++] = result;
  return result;
}